

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O2

Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
renderdesc::Loader::load_abi_cxx11_
          (Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this)

{
  Mapping *pMVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  EStack_68;
  allocator<char> local_40 [32];
  
  pMVar1 = this->root_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&EStack_68,"framebuffers",local_40);
  bVar2 = yaml::Mapping::hasKey(pMVar1,(string *)&EStack_68);
  std::__cxx11::string::~string((string *)&EStack_68);
  if (bVar2) {
    loadFramebuffers_abi_cxx11_(&EStack_68,this);
    if (EStack_68.has_value_ == false) {
      pbVar3 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error(&EStack_68);
      std::__cxx11::string::string((string *)local_40,(string *)pbVar3);
      goto LAB_0012030e;
    }
    Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected(&EStack_68);
  }
  pMVar1 = this->root_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&EStack_68,"textures",local_40);
  bVar2 = yaml::Mapping::hasKey(pMVar1,(string *)&EStack_68);
  std::__cxx11::string::~string((string *)&EStack_68);
  if (bVar2) {
    loadTextures_abi_cxx11_(&EStack_68,this);
    if (EStack_68.has_value_ == false) {
      pbVar3 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error(&EStack_68);
      std::__cxx11::string::string((string *)local_40,(string *)pbVar3);
      goto LAB_0012030e;
    }
    Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected(&EStack_68);
  }
  loadPrograms_abi_cxx11_(&EStack_68,this);
  if (EStack_68.has_value_ == false) {
    pbVar3 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error(&EStack_68);
    std::__cxx11::string::string((string *)local_40,(string *)pbVar3);
  }
  else {
    Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected(&EStack_68);
    loadCommands_abi_cxx11_(&EStack_68,this);
    if (EStack_68.has_value_ != false) {
      Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(&EStack_68);
      __return_storage_ptr__->has_value_ = true;
      return __return_storage_ptr__;
    }
    pbVar3 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error(&EStack_68);
    std::__cxx11::string::string((string *)local_40,(string *)pbVar3);
  }
LAB_0012030e:
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Expected(__return_storage_ptr__,(UnexpectedType *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Expected(&EStack_68);
  return __return_storage_ptr__;
}

Assistant:

Expected<void, std::string> load() {
		if (root_.hasKey("framebuffers")) {
			auto result = loadFramebuffers();
			if (!result)
				return Unexpected(result.error());
		}

		if (root_.hasKey("textures")) {
			auto result = loadTextures();
			if (!result)
				return Unexpected(result.error());
		}

		{
			auto result = loadPrograms();
			if (!result)
				return Unexpected(result.error());
		}

		{
			auto result = loadCommands();
			if (!result)
				return Unexpected(result.error());
		}

		return Expected<void, std::string>();
	}